

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O2

DdNode * BuildSubsetBdd(DdManager *dd,st__table *pathTable,DdNode *node,AssortedInfo *info,
                       st__table *subsetNodeTable)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  DdNode *pDVar4;
  FILE *__s;
  uint uVar5;
  uint uVar6;
  DdNode *pDVar7;
  int iVar8;
  ulong uVar9;
  DdNode *pDVar10;
  int *piVar11;
  DdNode *pDVar12;
  char *__ptr;
  uint uVar13;
  DdNode *pDVar14;
  int *key;
  int iVar15;
  DdNode *node_00;
  int *piVar16;
  size_t sStack_d0;
  NodeDist_t *nodeStat;
  DdNode *local_68;
  DdNode *local_60;
  ulong local_58;
  DdNode *local_50;
  char *entry;
  NodeDist_t *nodeStatNnv;
  NodeDist_t *nodeStatNv;
  
  pDVar10 = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (pDVar10->index == 0x7fffffff) {
    return node;
  }
  iVar1 = st__lookup(pathTable,(char *)pDVar10,(char **)&nodeStat);
  if (iVar1 == 0) {
    __s = (FILE *)dd->err;
    __ptr = "Something wrong, node must be in table \n";
    sStack_d0 = 0x28;
    goto LAB_00667f12;
  }
  local_60 = (DdNode *)((ulong)node & 1);
  if (local_60 == (DdNode *)0x0) {
    pDVar12 = nodeStat->regResult;
  }
  else {
    pDVar12 = nodeStat->compResult;
  }
  if (pDVar12 != (DdNode *)0x0) {
    return pDVar12;
  }
  pDVar12 = (pDVar10->type).kids.T;
  pDVar4 = (pDVar10->type).kids.E;
  pDVar7 = (DdNode *)((ulong)local_60 ^ (ulong)pDVar12);
  piVar11 = (int *)((ulong)pDVar12 & 0xfffffffffffffffe);
  if (*piVar11 == 0x7fffffff) {
    if ((dd->one == pDVar7) && (info->findShortestPath != 0)) {
      info->findShortestPath = 0;
    }
    piVar11[1] = piVar11[1] + 1;
    piVar11 = (int *)0x0;
    if (local_60 == pDVar12) {
      return (DdNode *)0x0;
    }
    iVar1 = 1;
    uVar3 = 0xffffffff;
    uVar13 = 0;
    pDVar12 = pDVar7;
LAB_00668039:
    pDVar14 = (DdNode *)((ulong)local_60 ^ (ulong)pDVar4);
    key = (int *)((ulong)pDVar4 & 0xfffffffffffffffe);
    local_68 = node;
    if (*key == 0x7fffffff) {
      if ((dd->one == pDVar14) && (info->findShortestPath != 0)) {
        info->findShortestPath = 0;
      }
      key[1] = key[1] + 1;
      if (local_60 == pDVar4) {
        return (DdNode *)0x0;
      }
      uVar5 = 0xffffffff;
      key = (int *)0x0;
      local_58 = 0;
      pDVar4 = pDVar14;
      iVar8 = iVar1 + 1;
LAB_00668125:
      uVar6 = (uint)local_58;
      do {
        local_50 = pDVar4;
        if (iVar8 == 0) {
          node_00 = pDVar7;
          piVar16 = piVar11;
          uVar2 = uVar13;
          iVar15 = 1;
          if ((uVar13 != uVar6 || uVar5 < uVar3) && uVar6 <= uVar13) {
            node_00 = pDVar14;
            piVar16 = key;
            uVar2 = (uint)local_58;
            iVar15 = iVar1;
          }
        }
        else {
          if (iVar8 == 2) {
            info->findShortestPath = 0;
            uVar3 = Cudd_NodeReadIndex(pDVar10);
            pDVar10 = Cudd_ReadVars(dd,uVar3);
            piVar11 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
            *piVar11 = *piVar11 + 1;
            pDVar7 = cuddBddIteRecur(dd,pDVar10,pDVar12,pDVar4);
            if (pDVar7 != (DdNode *)0x0) {
              piVar11 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
              *piVar11 = *piVar11 + 1;
            }
            Cudd_RecursiveDeref(dd,pDVar10);
            Cudd_RecursiveDeref(dd,pDVar12);
            Cudd_RecursiveDeref(dd,pDVar4);
            if (subsetNodeTable != (st__table *)0x0) {
              piVar11 = (int *)((ulong)pDVar7 & 0xfffffffffffffffe);
              iVar1 = st__lookup(subsetNodeTable,(char *)piVar11,&entry);
              if ((iVar1 == 0) && (*piVar11 != 0x7fffffff)) {
                iVar1 = st__insert(subsetNodeTable,(char *)piVar11,(char *)0x0);
                if (iVar1 == -10000) {
                  fwrite("Out of memory\n",0xe,1,(FILE *)dd->err);
                  return (DdNode *)0x0;
                }
                if (info->threshold < subsetNodeTable->num_entries) {
                  info->thresholdReached = 0;
                }
              }
            }
            if (pDVar7 == (DdNode *)0x0) {
              return (DdNode *)0x0;
            }
            uVar9 = (ulong)pDVar7 & 0xfffffffffffffffe;
            if (local_60 == (DdNode *)0x0) {
              nodeStat->regResult = pDVar7;
              iVar1 = *(int *)(uVar9 + 4) + 1;
              *(int *)(uVar9 + 4) = iVar1;
              if (pDVar7 != local_68) goto LAB_006684df;
              if (nodeStat->compResult != (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,nodeStat->compResult);
                iVar1 = *(int *)(uVar9 + 4);
              }
              nodeStat->compResult = (DdNode *)((ulong)pDVar7 ^ 1);
            }
            else {
              nodeStat->compResult = pDVar7;
              iVar1 = *(int *)(uVar9 + 4) + 1;
              *(int *)(uVar9 + 4) = iVar1;
              if (pDVar7 != local_68) goto LAB_006684df;
              if (nodeStat->regResult != (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,nodeStat->regResult);
                iVar1 = *(int *)(uVar9 + 4);
              }
              nodeStat->regResult = (DdNode *)((ulong)pDVar7 ^ 1);
            }
            *(int *)(uVar9 + 4) = iVar1 + 1;
LAB_006684df:
            *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + -1;
            return pDVar7;
          }
          uVar2 = (uint)local_58;
          node_00 = pDVar14;
          piVar16 = key;
          if (iVar1 == 0) {
            uVar2 = uVar13;
            node_00 = pDVar7;
            piVar16 = piVar11;
          }
          iVar15 = 1;
        }
        pDVar4 = zero;
        if (uVar2 <= info->maxpath) {
          if (uVar2 < info->maxpath) {
            if (info->findShortestPath != 0) {
              info->findShortestPath = 0;
            }
            pDVar4 = BuildSubsetBdd(dd,pathTable,node_00,info,subsetNodeTable);
          }
          else {
            iVar1 = st__lookup(info->maxpathTable,(char *)piVar16,&entry);
            if (iVar1 == 0) {
              if (info->thresholdReached < 1) {
                pDVar4 = zero;
                if (info->findShortestPath != 0) {
                  iVar1 = st__insert(info->maxpathTable,(char *)piVar16,(char *)0x0);
                  if (iVar1 == -10000) goto LAB_006682ac;
                  info->thresholdReached = info->thresholdReached + -1;
                  pDVar4 = BuildSubsetBdd(dd,pathTable,node_00,info,subsetNodeTable);
                }
              }
              else {
                iVar1 = st__insert(info->maxpathTable,(char *)piVar16,(char *)0x0);
                if (iVar1 != -10000) {
                  iVar1 = info->thresholdReached;
                  info->thresholdReached = iVar1 + -1;
                  if (iVar1 < 2) {
                    info->findShortestPath = 1;
                  }
                  goto LAB_00668229;
                }
LAB_006682ac:
                memOut = 1;
                fwrite("OUT of memory\n",0xe,1,(FILE *)dd->err);
                info->thresholdReached = 0;
                pDVar4 = zero;
              }
            }
            else {
              if (info->findShortestPath != 0) {
                info->findShortestPath = 0;
              }
LAB_00668229:
              pDVar4 = BuildSubsetBdd(dd,pathTable,node_00,info,subsetNodeTable);
            }
          }
        }
        if (pDVar4 == (DdNode *)0x0) {
          if (pDVar12 != (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar12);
          }
          if (local_50 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          Cudd_RecursiveDeref(dd,local_50);
          return (DdNode *)0x0;
        }
        piVar16 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar16 = *piVar16 + 1;
        if (node_00 == pDVar7) {
          pDVar12 = pDVar4;
          pDVar4 = local_50;
        }
        iVar8 = iVar8 + 1;
        iVar1 = iVar15;
      } while( true );
    }
    iVar8 = st__lookup(pathTable,(char *)key,(char **)&nodeStatNnv);
    if (iVar8 != 0) {
      uVar6 = 0xffffffff;
      uVar5 = uVar6;
      if ((nodeStatNnv->oddTopDist != 0xffffffff) &&
         (uVar5 = nodeStatNnv->oddTopDist + nodeStatNnv->oddBotDist,
         nodeStatNnv->oddBotDist == 0xffffffff)) {
        uVar5 = 0xffffffff;
      }
      if ((nodeStatNnv->evenTopDist != 0xffffffff) &&
         (uVar6 = nodeStatNnv->evenTopDist + nodeStatNnv->evenBotDist,
         nodeStatNnv->evenBotDist == 0xffffffff)) {
        uVar6 = 0xffffffff;
      }
      uVar2 = uVar6;
      if (uVar5 < uVar6) {
        uVar2 = uVar5;
      }
      local_58 = (ulong)uVar2;
      uVar5 = (&nodeStatNnv->oddBotDist)[uVar6 < uVar5];
      pDVar4 = (DdNode *)0x0;
      iVar8 = iVar1;
      goto LAB_00668125;
    }
  }
  else {
    iVar1 = st__lookup(pathTable,(char *)piVar11,(char **)&nodeStatNv);
    if (iVar1 != 0) {
      uVar5 = 0xffffffff;
      uVar3 = uVar5;
      if ((nodeStatNv->oddTopDist != 0xffffffff) &&
         (uVar3 = nodeStatNv->oddTopDist + nodeStatNv->oddBotDist,
         nodeStatNv->oddBotDist == 0xffffffff)) {
        uVar3 = 0xffffffff;
      }
      if ((nodeStatNv->evenTopDist != 0xffffffff) &&
         (uVar5 = nodeStatNv->evenTopDist + nodeStatNv->evenBotDist,
         nodeStatNv->evenBotDist == 0xffffffff)) {
        uVar5 = 0xffffffff;
      }
      uVar13 = uVar5;
      if (uVar3 < uVar5) {
        uVar13 = uVar3;
      }
      uVar3 = (&nodeStatNv->oddBotDist)[uVar5 < uVar3];
      pDVar12 = (DdNode *)0x0;
      iVar1 = 0;
      goto LAB_00668039;
    }
  }
  __s = (FILE *)dd->err;
  __ptr = "Something wrong, node must be in table\n";
  sStack_d0 = 0x27;
LAB_00667f12:
  fwrite(__ptr,sStack_d0,1,__s);
  dd->errorCode = CUDD_INTERNAL_ERROR;
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
BuildSubsetBdd(
  DdManager * dd /* DD manager */,
  DdNode * node /* current node */,
  int * size /* current size of the subset */,
  st__table * visitedTable /* visited table storing all node data */,
  int  threshold,
  st__table * storeTable,
  st__table * approxTable)
{

    DdNode *Nv, *Nnv, *N, *topv, *neW;
    double minNv, minNnv;
    NodeData_t *currNodeQual;
    NodeData_t *currNodeQualT;
    NodeData_t *currNodeQualE;
    DdNode *ThenBranch, *ElseBranch;
    unsigned int topid;
    char *dummy;

#ifdef DEBUG
    num_calls++;
#endif
    /*If the size of the subset is below the threshold, dont do
      anything. */
    if ((*size) <= threshold) {
      /* store nodes below this, so we can recombine if possible */
      StoreNodes(storeTable, dd, node);
      return(node);
    }

    if (Cudd_IsConstant(node))
        return(node);

    /* Look up minterm count for this node. */
    if (! st__lookup(visitedTable, (const char *)node, (char **)&currNodeQual)) {
        fprintf(dd->err,
                "Something is wrong, ought to be in node quality table\n");
    }

    /* Get children. */
    N = Cudd_Regular(node);
    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    /* complement if necessary */
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    if (!Cudd_IsConstant(Nv)) {
        /* find out minterms and nodes contributed by then child */
        if (! st__lookup(visitedTable, (const char *)Nv, (char **)&currNodeQualT)) {
                fprintf(dd->out,"Something wrong, couldnt find nodes in node quality table\n");
                dd->errorCode = CUDD_INTERNAL_ERROR;
                return(NULL);
            }
        else {
            minNv = *(((NodeData_t *)currNodeQualT)->mintermPointer);
        }
    } else {
        if (Nv == zero) {
            minNv = 0;
        } else  {
            minNv = max;
        }
    }
    if (!Cudd_IsConstant(Nnv)) {
        /* find out minterms and nodes contributed by else child */
        if (! st__lookup(visitedTable, (const char *)Nnv, (char **)&currNodeQualE)) {
            fprintf(dd->out,"Something wrong, couldnt find nodes in node quality table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        } else {
            minNnv = *(((NodeData_t *)currNodeQualE)->mintermPointer);
        }
    } else {
        if (Nnv == zero) {
            minNnv = 0;
        } else {
            minNnv = max;
        }
    }

    /* keep track of size of subset by subtracting the number of
     * differential nodes contributed by lighter child
     */
    *size = (*(size)) - (int)*(currNodeQual->lightChildNodesPointer);
    if (minNv >= minNnv) { /*SubsetCountNodesAux procedure takes
                             the Then branch in case of a tie */

        /* recur with the Then branch */
        ThenBranch = (DdNode *)BuildSubsetBdd(dd, Nv, size,
              visitedTable, threshold, storeTable, approxTable);
        if (ThenBranch == NULL) {
            return(NULL);
        }
        cuddRef(ThenBranch);
        /* The Else branch is either a node that already exists in the
         * subset, or one whose approximation has been computed, or
         * Zero.
         */
        if ( st__lookup(storeTable, (char *)Cudd_Regular(Nnv), &dummy)) {
          ElseBranch = Nnv;
          cuddRef(ElseBranch);
        } else {
          if ( st__lookup(approxTable, (char *)Nnv, &dummy)) {
            ElseBranch = (DdNode *)dummy;
            cuddRef(ElseBranch);
          } else {
            ElseBranch = zero;
            cuddRef(ElseBranch);
          }
        }

    }
    else {
        /* recur with the Else branch */
        ElseBranch = (DdNode *)BuildSubsetBdd(dd, Nnv, size,
                      visitedTable, threshold, storeTable, approxTable);
        if (ElseBranch == NULL) {
            return(NULL);
        }
        cuddRef(ElseBranch);
        /* The Then branch is either a node that already exists in the
         * subset, or one whose approximation has been computed, or
         * Zero.
         */
        if ( st__lookup(storeTable, (char *)Cudd_Regular(Nv), &dummy)) {
          ThenBranch = Nv;
          cuddRef(ThenBranch);
        } else {
          if ( st__lookup(approxTable, (char *)Nv, &dummy)) {
            ThenBranch = (DdNode *)dummy;
            cuddRef(ThenBranch);
          } else {
            ThenBranch = zero;
            cuddRef(ThenBranch);
          }
        }
    }

    /* construct the Bdd with the top variable and the two children */
    topid = Cudd_NodeReadIndex(N);
    topv = Cudd_ReadVars(dd, topid);
    cuddRef(topv);
    neW =  cuddBddIteRecur(dd, topv, ThenBranch, ElseBranch);
    if (neW != NULL) {
      cuddRef(neW);
    }
    Cudd_RecursiveDeref(dd, topv);
    Cudd_RecursiveDeref(dd, ThenBranch);
    Cudd_RecursiveDeref(dd, ElseBranch);


    if (neW == NULL)
        return(NULL);
    else {
        /* store this node in the store table */
        if (! st__lookup(storeTable, (char *)Cudd_Regular(neW), &dummy)) {
          cuddRef(neW);
          if (! st__insert(storeTable, (char *)Cudd_Regular(neW), NIL(char)))
              return (NULL);
        }
        /* store the approximation for this node */
        if (N !=  Cudd_Regular(neW)) {
            if ( st__lookup(approxTable, (char *)node, &dummy)) {
                fprintf(dd->err, "This node should not be in the approximated table\n");
            } else {
                cuddRef(neW);
                if (! st__insert(approxTable, (char *)node, (char *)neW))
                    return(NULL);
            }
        }
        cuddDeref(neW);
        return(neW);
    }
}